

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFExporter::ExportScene(glTFExporter *this)

{
  uint uVar1;
  element_type *peVar2;
  Scene *pSVar3;
  Ref<glTF::Scene> RVar4;
  Ref<glTF::Node> RVar5;
  value_type local_48;
  vector<glTF::Scene_*,_std::allocator<glTF::Scene_*>_> *local_38;
  uint local_30;
  undefined1 local_28 [8];
  Ref<glTF::Scene> scene;
  char *sceneName;
  glTFExporter *this_local;
  
  scene._8_8_ = anon_var_dwarf_105a806;
  peVar2 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  RVar4 = glTF::LazyDict<glTF::Scene>::Create(&peVar2->scenes,(char *)scene._8_8_);
  local_38 = RVar4.vector;
  local_30 = RVar4.index;
  local_28 = (undefined1  [8])local_38;
  scene.vector._0_4_ = local_30;
  peVar2 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  uVar1 = glTF::LazyDict<glTF::Node>::Size(&peVar2->nodes);
  if (uVar1 != 0) {
    pSVar3 = glTF::Ref<glTF::Scene>::operator->((Ref<glTF::Scene> *)local_28);
    peVar2 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar5 = glTF::LazyDict<glTF::Node>::Get(&peVar2->nodes,0);
    local_48.vector = RVar5.vector;
    local_48.index = RVar5.index;
    std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
              (&pSVar3->nodes,&local_48);
  }
  peVar2 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  (peVar2->scene).vector = (vector<glTF::Scene_*,_std::allocator<glTF::Scene_*>_> *)local_28;
  (peVar2->scene).index = (uint)scene.vector;
  return;
}

Assistant:

void glTFExporter::ExportScene()
{
    const char* sceneName = "defaultScene";
    Ref<Scene> scene = mAsset->scenes.Create(sceneName);

    // root node will be the first one exported (idx 0)
    if (mAsset->nodes.Size() > 0) {
        scene->nodes.push_back(mAsset->nodes.Get(0u));
    }

    // set as the default scene
    mAsset->scene = scene;
}